

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O2

void semchecker(void)

{
  int iVar1;
  anon_union_8_4_35def4f3_for_attr_1 aVar2;
  anon_union_8_4_35def4f3_for_attr_1 aVar3;
  field_t *pfVar4;
  field_t *pfVar5;
  arg_t *paVar6;
  attr *paVar7;
  attr *paVar8;
  ast *a;
  ast *paVar9;
  ast *paVar10;
  attr *a_00;
  func_t *pfVar11;
  ast *paVar12;
  char *s;
  field_t *local_58;
  attr local_50;
  attr readFunc;
  
  a = ast_root;
  newenv();
  local_50.kind = 3;
  readFunc.kind = local_50.kind;
  aVar2.basic = (basic_t *)calloc(1,0x18);
  readFunc.field_1.basic = aVar2.basic;
  aVar3.basic = (basic_t *)calloc(1,0x18);
  local_50.field_1.basic = aVar3.basic;
  pfVar4 = (field_t *)calloc(1,0x10);
  (aVar2.structure)->field = pfVar4;
  pfVar5 = (field_t *)calloc(1,0x10);
  (aVar3.structure)->field = pfVar5;
  (aVar2.basic)->name = "read";
  (aVar3.basic)->name = "write";
  paVar6 = (arg_t *)calloc(1,0x10);
  (aVar3.function)->arg_list = paVar6;
  paVar7 = (attr *)calloc(1,0x10);
  pfVar4->type = paVar7;
  paVar8 = (attr *)calloc(1,0x10);
  pfVar5->type = paVar8;
  *(undefined4 *)&paVar7->field_1 = 2;
  *(undefined4 *)&paVar8->field_1 = 2;
  paVar6->arg = (attr *)pfVar5;
  insertfunc("read",&readFunc);
  insertfunc((aVar3.basic)->name,&local_50);
  iVar1 = 1;
  while (a = child(a,iVar1), a->type != -1) {
    paVar9 = child(a,1);
    paVar10 = child(paVar9,1);
    paVar7 = SEM_Specifier(paVar10);
    paVar10 = child(paVar9,2);
    local_58 = (field_t *)0x0;
    iVar1 = paVar10->type;
    if (iVar1 == 0x104) {
      child(paVar9,1);
    }
    else if (iVar1 == -0x2707) {
      paVar9 = child(paVar10,3);
      a_00 = (attr *)malloc(0x10);
      a_00->kind = 3;
      pfVar11 = (func_t *)malloc(0x18);
      (a_00->field_1).function = pfVar11;
      paVar8 = paVar7;
      if ((paVar7->kind == 2) &&
         (paVar8 = findvar(((paVar7->field_1).basic)->name), paVar8 == (attr *)0x0)) {
        semerror(1,paVar10->pos->first_line,semErrorMsg[1],((paVar7->field_1).basic)->name);
        paVar8 = paVar7;
      }
      pfVar11->return_type = paVar8;
      paVar12 = child(paVar10,1);
      s = paVar12->val->typeval;
      pfVar11->name = s;
      cur_func = s;
      if (paVar9->type == 0x111) {
        paVar6 = (arg_t *)0x0;
      }
      else {
        paVar6 = SEM_VarList(paVar9,&local_58);
        s = pfVar11->name;
      }
      pfVar11->arg_list = paVar6;
      iVar1 = insertfunc(s,a_00);
      if (iVar1 == 0) {
        semerror(4,paVar10->pos->first_line,semErrorMsg[4],((a_00->field_1).basic)->name);
      }
      paVar9 = sibling(paVar10,1);
      SEM_CompSt(paVar9,local_58);
    }
    else if (iVar1 == -0x270d) {
      do {
        paVar9 = child(paVar10,1);
        SEM_VarDec(paVar9,paVar7,1);
        paVar10 = child(paVar10,3);
      } while (paVar10 != (ast *)0x0);
    }
    iVar1 = 2;
  }
  return;
}

Assistant:

void semchecker() {
    SEM_Program(ast_root);
}